

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O3

int Bmc_MeshAddOneHotness(satoko_t *pSat,int iFirst,int iLast)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  uint uVar11;
  int pLits [2];
  int pVars [100];
  int local_1e0;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  uint uStack_1c8;
  undefined1 local_1c4 [404];
  
  if ((iLast <= iFirst) || (iFirst + 0x6e <= iLast)) {
    __assert_fail("iFirst < iLast && iFirst + 110 > iLast",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                  ,0x4a,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
  }
  uVar11 = 0;
  do {
    cVar3 = satoko_var_polarity(pSat,iFirst);
    if (cVar3 == '\0') {
      if (99 < (int)uVar11) {
        __assert_fail("nVars < 100",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                      ,0x4e,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
      }
      lVar6 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      *(int *)(local_1c4 + lVar6 * 4 + -4) = iFirst;
    }
    iFirst = iFirst + 1;
  } while (iLast != iFirst);
  iVar5 = 0;
  if (1 < (int)uVar11) {
    uVar7 = (ulong)uVar11;
    puVar9 = local_1c4;
    iVar5 = 0;
    uVar8 = 0;
    uVar10 = uVar7;
    local_1d8 = uVar7;
    do {
      uVar10 = uVar10 - 1;
      local_1d0 = uVar8 + 1;
      if (local_1d0 < uVar7) {
        iVar2 = *(int *)(local_1c4 + uVar8 * 4 + -4);
        iVar1 = iVar2 * 2 + 1;
        uVar7 = 0;
        do {
          if (iVar2 < 0) {
LAB_00588071:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          local_1e0 = iVar1;
          if (*(int *)(puVar9 + uVar7 * 4) < 0) goto LAB_00588071;
          local_1dc = *(int *)(puVar9 + uVar7 * 4) * 2 + 1;
          iVar4 = satoko_add_clause(pSat,&local_1e0,2);
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0x59,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
        iVar5 = iVar5 + (int)uVar7;
        uVar7 = local_1d8;
      }
      puVar9 = puVar9 + 4;
      uVar8 = local_1d0;
    } while (local_1d0 != uVar7);
  }
  return iVar5;
}

Assistant:

int Bmc_MeshAddOneHotness( satoko_t * pSat, int iFirst, int iLast )
{
    int i, j, v, pVars[100], nVars  = 0, nCount = 0;
    assert( iFirst < iLast && iFirst + 110 > iLast );
    for ( v = iFirst; v < iLast; v++ )
        if ( Bmc_MeshVarValue(pSat, v) ) // v = 1
        {
            assert( nVars < 100 );
            pVars[ nVars++ ] = v;
        }
    if ( nVars <= 1 )
        return 0;
    for ( i = 0;   i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
    {
        int pLits[2], RetValue;
        pLits[0] = Abc_Var2Lit( pVars[i], 1 );
        pLits[1] = Abc_Var2Lit( pVars[j], 1 );
        RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
        nCount++;
    }
    return nCount;
}